

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__unnormalized
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  xmlChar *pxVar2;
  long lVar3;
  undefined8 uVar4;
  long *plVar5;
  void *pvVar6;
  StackMemoryManager *this_00;
  xmlChar **ppxVar7;
  
  this_00 = &(this->
             super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
             ).super_ParserTemplateBase.mStackMemoryManager;
  plVar5 = (long *)GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x10);
  uVar4 = unnormalized__AttributeData::DEFAULT._8_8_;
  *plVar5 = unnormalized__AttributeData::DEFAULT._0_8_;
  plVar5[1] = uVar4;
  *attributeDataPtr = plVar5;
  ppxVar7 = attributes->attributes;
  ppxVar1 = ppxVar7;
  while (ppxVar1 != (xmlChar **)0x0) {
    ppxVar1 = (xmlChar **)*ppxVar7;
    if (ppxVar1 != (xmlChar **)0x0) {
      pxVar2 = ppxVar7[1];
      if (*plVar5 == 0) {
        pvVar6 = GeneratedSaxParser::StackMemoryManager::newObject(this_00,0x10);
      }
      else {
        pvVar6 = GeneratedSaxParser::StackMemoryManager::growObject(this_00,0x10);
      }
      ppxVar7 = ppxVar7 + 2;
      *plVar5 = (long)pvVar6;
      lVar3 = plVar5[1];
      *(xmlChar ***)((long)pvVar6 + lVar3 * 8) = ppxVar1;
      *(xmlChar **)(*plVar5 + 8 + lVar3 * 8) = pxVar2;
      plVar5[1] = lVar3 + 2;
    }
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__unnormalized( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__unnormalized( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

unnormalized__AttributeData* attributeData = newData<unnormalized__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


        if ( !attributeData->unknownAttributes.data )
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.newObject( 2 * sizeof( const ParserChar* ) );
        else
            attributeData->unknownAttributes.data = (const ParserChar**)mStackMemoryManager.growObject( 2 * sizeof( const ParserChar* ) );
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size ] = attribute;
        attributeData->unknownAttributes.data[ attributeData->unknownAttributes.size+1 ] = attributeValue;
        attributeData->unknownAttributes.size += 2;

    }
}


    return true;
}